

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall capnp::EzRpcClient::Impl::Impl(Impl *this,int socketFd,ReaderOptions readerOpts)

{
  LowLevelAsyncIoProvider *pLVar1;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::AsyncIoStream> local_40;
  ReaderOptions local_30;
  
  local_30.traversalLimitInWords = readerOpts.traversalLimitInWords;
  local_30.nestingLimit = readerOpts.nestingLimit;
  EzRpcContext::getThreadLocal();
  kj::Promise<void>::Promise((Promise<void> *)&local_58);
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  kj::Own<kj::_::PromiseNode>::dispose(&local_58);
  pLVar1 = (((this->context).ptr)->ioContext).lowLevelProvider.ptr;
  (*pLVar1->_vptr_LowLevelAsyncIoProvider[2])(&local_40,pLVar1,socketFd,0);
  kj::heap<capnp::EzRpcClient::Impl::ClientContext,kj::Own<kj::AsyncIoStream>,capnp::ReaderOptions&>
            ((kj *)&local_58,&local_40,&local_30);
  (this->clientContext).ptr.disposer = local_58.disposer;
  (this->clientContext).ptr.ptr = (ClientContext *)local_58.ptr;
  local_58.ptr = (PromiseNode *)0x0;
  kj::Own<kj::AsyncIoStream>::dispose(&local_40);
  return;
}

Assistant:

Impl(int socketFd, ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(kj::Promise<void>(kj::READY_NOW).fork()),
        clientContext(kj::heap<ClientContext>(
            context->getLowLevelIoProvider().wrapSocketFd(socketFd),
            readerOpts)) {}